

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Custom.cpp
# Opt level: O0

void __thiscall
Iir::Custom::TwoPole::setup
          (TwoPole *this,double scale,double poleRho,double poleTheta,double zeroRho,
          double zeroTheta)

{
  complex_t zero2;
  complex_t pole2;
  complex_t zero1;
  Biquad *in_RDI;
  double in_XMM0_Qa;
  complex_t zero;
  complex_t pole;
  undefined1 in_stack_00000098 [16];
  complex<double> *in_stack_ffffffffffffff70;
  double *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff80;
  
  std::polar<double>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::polar<double>(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::conj<double>(in_stack_ffffffffffffff70);
  std::conj<double>(in_stack_ffffffffffffff70);
  zero1._M_value._8_8_ = this;
  zero1._M_value._0_8_ = scale;
  pole2._M_value._8_8_ = poleRho;
  pole2._M_value._0_8_ = poleTheta;
  zero2._M_value._8_8_ = zeroRho;
  zero2._M_value._0_8_ = zeroTheta;
  Biquad::setTwoPole((Biquad *)pole._M_value._8_8_,(complex_t)in_stack_00000098,zero1,pole2,zero2);
  Biquad::applyScale(in_RDI,in_XMM0_Qa);
  return;
}

Assistant:

void TwoPole::setup (double scale,
                     double poleRho,
                     double poleTheta,
                     double zeroRho,
                     double zeroTheta)
{
  complex_t pole = std::polar (poleRho, poleTheta);
  complex_t zero = std::polar (zeroRho, zeroTheta);

  setTwoPole (pole, zero, std::conj(pole), std::conj(zero));
  applyScale (scale);
}